

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_unpack.h
# Opt level: O0

void serialization::
     unserialize_unpack<char_const*const*&,serialization::xml_iarchive,std::__cxx11::string,std::map<std::__cxx11::string,Person,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Person>>>&,std::vector<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::allocator<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>&>
               (char ***arg,xml_iarchive *ar,
               optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *front,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>_>_>
                      *next,
               vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
               *next_1)

{
  bool bVar1;
  undefined1 local_60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tmp;
  char *key;
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  *pvStack_30;
  serialization_trace trace;
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  *next_local_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>_>_>
  *next_local;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *front_local;
  xml_iarchive *ar_local;
  char ***arg_local;
  
  key._0_4_ = 0x48;
  pvStack_30 = next_1;
  serialization_trace::serialization_trace<char_const(&)[19],char_const(&)[140],int>
            ((serialization_trace *)((long)&key + 7),(char (*) [19])"unserialize_unpack",
             (char (*) [140])
             "/workspace/llm4binary/github/license_c_cmakelists/avplayer[P]serialization2/examples/../include/serialization/detail/serialization_unpack.h"
             ,(int *)&key);
  tmp.field_2._8_8_ = **arg;
  bVar1 = xml_iarchive::load_key_start_optional(ar,(char *)tmp.field_2._8_8_);
  if (bVar1) {
    std::__cxx11::string::string((string *)local_60);
    unserialize_helper<serialization::xml_iarchive,std::__cxx11::string>
              (ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
    std::optional<std::__cxx11::string>::emplace<std::__cxx11::string>
              ((optional<std::__cxx11::string> *)front,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
    xml_iarchive::load_key_end(ar,(char *)tmp.field_2._8_8_);
    std::__cxx11::string::~string((string *)local_60);
  }
  *arg = *arg + 1;
  unserialize_unpack<char_const*const*&,serialization::xml_iarchive,std::map<std::__cxx11::string,Person,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Person>>>&,std::vector<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::allocator<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>&>
            (arg,ar,next,pvStack_30);
  return;
}

Assistant:

inline void unserialize_unpack(Argument && arg, const Archive & ar, std::optional<T> & front, Args&& ... next)
{
    serialization_trace trace(__func__, __FILE__, __LINE__);

    auto key = *arg;

    if(ar.load_key_start_optional(key))
    {
        T tmp;
        unserialize_helper(ar, tmp);
        front.emplace(std::move(tmp));
        ar.load_key_end(key);
    }

    unserialize_unpack(++arg, ar, std::forward<Args>(next)...);
}